

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

path * GetAuthCookieFile(path *__return_storage_ptr__,bool temp)

{
  long lVar1;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff68;
  undefined1 local_60 [32];
  path arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"-rpccookiefile",(allocator<char> *)&stack0xffffffffffffff77);
  fs::path::path((path *)&stack0xffffffffffffff78,".cookie");
  ArgsManager::GetPathArg(&arg,&gArgs,in_stack_ffffffffffffff68,(path *)local_60);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)local_60);
  if (temp) {
    std::filesystem::__cxx11::path::operator+=(&arg.super_path,".tmp");
  }
  AbsPathForConfigVal(__return_storage_ptr__,&gArgs,&arg,true);
  std::filesystem::__cxx11::path::~path(&arg.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetAuthCookieFile(bool temp=false)
{
    fs::path arg = gArgs.GetPathArg("-rpccookiefile", COOKIEAUTH_FILE);
    if (temp) {
        arg += ".tmp";
    }
    return AbsPathForConfigVal(gArgs, arg);
}